

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser_p.h
# Opt level: O0

void __thiscall
QDateTimeParser::QDateTimeParser(QDateTimeParser *this,Type t,Context ctx,QCalendar cal)

{
  long lVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR__QDateTimeParser_00beb7e8;
  *(undefined4 *)(in_RDI + 1) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0xc) = 0x76c;
  QFlags<QDateTimeParser::Section>::QFlags((QFlags<QDateTimeParser::Section> *)0x4e3457);
  *(undefined4 *)((long)in_RDI + 0x14) = 0xffffffff;
  QString::QString((QString *)0x4e3471);
  QList<QDateTimeParser::SectionNode>::QList((QList<QDateTimeParser::SectionNode> *)0x4e3484);
  QList<QString>::QList((QList<QString> *)0x4e3497);
  QString::QString((QString *)0x4e34aa);
  QLocale::system((char *)(in_RDI + 0xf));
  *(undefined4 *)(in_RDI + 0x10) = in_ESI;
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  *(undefined4 *)(in_RDI + 0x11) = in_EDX;
  in_RDI[0x12] = in_RCX;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeParser(QMetaType::Type t, Context ctx, QCalendar cal = QCalendar())
        : defaultLocale(QLocale::system()), parserType(t), context(ctx), calendar(cal)
    {
    }